

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O1

void find_moves(void)

{
  char *pcVar1;
  char **ppcVar2;
  bool bVar3;
  int ***pppiVar4;
  char c;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  calc_adj();
  c = 'A';
  do {
    calc_legal(c);
    pppiVar4 = adj;
    c = c + '\x01';
  } while (c != '[');
  if (start == true) {
    adj[1][6][6] = 1;
    (*pppiVar4)[6][6] = 1;
  }
  full_rack = rack_size == 7;
  std::vector<Move,_std::allocator<Move>_>::_M_erase_at_end
            (&moves,moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_start);
  if (0 < bsize) {
    lVar9 = 0;
    lVar5 = 1;
    do {
      if (0 < bsize) {
        lVar7 = 0;
        lVar8 = 1;
        do {
          lVar6 = lVar7;
          if (board[lVar5][lVar8] == '\0') {
            do {
              pcVar1 = board[lVar5] + lVar6;
              lVar6 = lVar6 + -1;
            } while ('\x01' < *pcVar1);
            find_moves_at((int)lVar5,(int)lVar6 + 2,true,false,-1,0);
            lVar6 = lVar9;
            do {
              ppcVar2 = board + lVar6;
              lVar6 = lVar6 + -1;
            } while ('\x01' < (*ppcVar2)[lVar8]);
            find_moves_at((int)lVar6 + 2,(int)lVar8,false,false,-1,0);
          }
          lVar7 = lVar7 + 1;
          bVar3 = lVar8 < bsize;
          lVar8 = lVar8 + 1;
        } while (bVar3);
      }
      lVar9 = lVar9 + 1;
      bVar3 = lVar5 < bsize;
      lVar5 = lVar5 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void find_moves() {
    calc_adj();
    calc_legal_all();
    if (start) adj[0][6][6] = adj[1][6][6] = 1;
    full_rack = (rack_size == 7);
    moves.clear();
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            if (board[i][j] == 0) { //only look on free squares to avoid redundancy
                int j1 = j;
                while (board[i][--j1] > 1); //go to leftmost taken square on board
                find_moves_at(i, j1 + 1, true);
                int i1 = i;
                while (board[--i1][j] > 1);
                find_moves_at(i1 + 1, j, false);
            }
        }
    }
}